

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long
AdaptingOutputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostOutputChannels,unsigned_long framesToProcess)

{
  uint uVar1;
  void **ppvVar2;
  PaStreamCallbackTimeInfo *pPVar3;
  int iVar4;
  void ***pppvVar5;
  ulong uVar6;
  PaUtilChannelDescriptor *pPVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  long lVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  uint local_6c;
  
  uVar10 = 0;
  do {
    uVar9 = bp->framesInTempOutputBuffer;
    uVar8 = framesToProcess;
    if (uVar9 == 0) {
      if (*streamCallbackResult == 0) {
        pppvVar5 = (void ***)&bp->tempOutputBuffer;
        if (bp->userOutputIsInterleaved == 0) {
          uVar1 = bp->outputChannelCount;
          for (uVar9 = 0; pppvVar5 = &bp->tempOutputBufferPtrs, uVar1 != uVar9; uVar9 = uVar9 + 1) {
            bp->tempOutputBufferPtrs[uVar9] =
                 (void *)((ulong)bp->bytesPerUserOutputSample * bp->framesPerUserBuffer * uVar9 +
                         (long)bp->tempOutputBuffer);
          }
        }
        ppvVar2 = *pppvVar5;
        pPVar3 = bp->timeInfo;
        pPVar3->inputBufferAdcTime = 0.0;
        iVar4 = (*bp->streamCallback)
                          ((void *)0x0,ppvVar2,bp->framesPerUserBuffer,pPVar3,
                           bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar4;
        if (iVar4 == 2) {
          uVar9 = bp->framesInTempOutputBuffer;
        }
        else {
          uVar9 = bp->framesPerUserBuffer;
          auVar13._8_4_ = (int)(uVar9 >> 0x20);
          auVar13._0_8_ = uVar9;
          auVar13._12_4_ = 0x45300000;
          bp->timeInfo->outputBufferDacTime =
               ((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * bp->samplePeriod +
               bp->timeInfo->outputBufferDacTime;
          bp->framesInTempOutputBuffer = uVar9;
        }
        if (uVar9 != 0) goto LAB_0010c226;
      }
      pPVar7 = hostOutputChannels;
      for (uVar9 = 0; uVar9 < bp->outputChannelCount; uVar9 = uVar9 + 1) {
        (*bp->outputZeroer)(pPVar7->data,pPVar7->stride,(uint)framesToProcess);
        pPVar7->data = (void *)((long)pPVar7->data +
                               (ulong)bp->bytesPerHostOutputSample *
                               pPVar7->stride * framesToProcess);
        pPVar7 = pPVar7 + 1;
      }
    }
    else {
LAB_0010c226:
      if (uVar9 < framesToProcess) {
        uVar8 = uVar9;
      }
      uVar1 = bp->bytesPerUserOutputSample;
      uVar6 = (ulong)uVar1;
      if (bp->userOutputIsInterleaved == 0) {
        lVar11 = (bp->framesPerUserBuffer - uVar9) * uVar6;
        local_6c = 1;
        uVar6 = (ulong)((int)bp->framesPerUserBuffer * uVar1);
      }
      else {
        local_6c = bp->outputChannelCount;
        lVar11 = (bp->framesPerUserBuffer - uVar9) * (ulong)(local_6c * uVar1);
      }
      pvVar12 = (void *)(lVar11 + (long)bp->tempOutputBuffer);
      pPVar7 = hostOutputChannels;
      for (uVar9 = 0; uVar9 < bp->outputChannelCount; uVar9 = uVar9 + 1) {
        (*bp->outputConverter)
                  (pPVar7->data,pPVar7->stride,pvVar12,local_6c,(uint)uVar8,&bp->ditherGenerator);
        pPVar7->data = (void *)((long)pPVar7->data +
                               (ulong)bp->bytesPerHostOutputSample * pPVar7->stride * uVar8);
        pvVar12 = (void *)((long)pvVar12 + uVar6);
        pPVar7 = pPVar7 + 1;
      }
      bp->framesInTempOutputBuffer = bp->framesInTempOutputBuffer - uVar8;
    }
    uVar10 = uVar10 + uVar8;
    framesToProcess = framesToProcess - uVar8;
    if (framesToProcess == 0) {
      return uVar10;
    }
  } while( true );
}

Assistant:

static unsigned long AdaptingOutputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostOutputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *srcBytePtr;
    unsigned int srcSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int srcChannelStrideBytes;  /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;

    do
    {
        if( bp->framesInTempOutputBuffer == 0 && *streamCallbackResult == paContinue )
        {
            userInput = 0;

            /* setup userOutput */
            if( bp->userOutputIsInterleaved )
            {
                userOutput = bp->tempOutputBuffer;
            }
            else /* user output is not interleaved */
            {
                for( i = 0; i < bp->outputChannelCount; ++i )
                {
                    bp->tempOutputBufferPtrs[i] = ((unsigned char*)bp->tempOutputBuffer) +
                            i * bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
                }

                userOutput = bp->tempOutputBufferPtrs;
            }

            bp->timeInfo->inputBufferAdcTime = 0;

            *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                    bp->framesPerUserBuffer, bp->timeInfo,
                    bp->callbackStatusFlags, bp->userData );

            if( *streamCallbackResult == paAbort )
            {
                /* if the callback returned paAbort, we disregard its output */
            }
            else
            {
                bp->timeInfo->outputBufferDacTime += bp->framesPerUserBuffer * bp->samplePeriod;

                bp->framesInTempOutputBuffer = bp->framesPerUserBuffer;
            }
        }

        if( bp->framesInTempOutputBuffer > 0 )
        {
            /* convert frameCount frames from user buffer to host buffer */

            frameCount = PA_MIN_( bp->framesInTempOutputBuffer, framesToGo );

            if( bp->userOutputIsInterleaved )
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample * bp->outputChannelCount *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = bp->outputChannelCount;
                srcChannelStrideBytes = bp->bytesPerUserOutputSample;
            }
            else /* user output is not interleaved */
            {
                srcBytePtr = ((unsigned char*)bp->tempOutputBuffer) +
                        bp->bytesPerUserOutputSample *
                        (bp->framesPerUserBuffer - bp->framesInTempOutputBuffer);

                srcSampleStrideSamples = 1;
                srcChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserOutputSample;
            }

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputConverter(    hostOutputChannels[i].data,
                                        hostOutputChannels[i].stride,
                                        srcBytePtr, srcSampleStrideSamples,
                                        frameCount, &bp->ditherGenerator );

                srcBytePtr += srcChannelStrideBytes;  /* skip to next source channel */

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }

            bp->framesInTempOutputBuffer -= frameCount;
        }
        else
        {
            /* no more user data is available because the callback has returned
                paComplete or paAbort. Fill the remainder of the host buffer
                with zeros.
            */

            frameCount = framesToGo;

            for( i=0; i<bp->outputChannelCount; ++i )
            {
                bp->outputZeroer(   hostOutputChannels[i].data,
                                    hostOutputChannels[i].stride,
                                    frameCount );

                /* advance dest ptr for next iteration */
                hostOutputChannels[i].data = ((unsigned char*)hostOutputChannels[i].data) +
                        frameCount * hostOutputChannels[i].stride * bp->bytesPerHostOutputSample;
            }
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;

    }while( framesToGo > 0 );

    return framesProcessed;
}